

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

ssize_t __thiscall Bstrlib::CBStream::read(CBStream *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  CBStringException *this_00;
  undefined4 in_register_00000034;
  bstring local_88;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  CBStringException bstr__cppwrapper_exception;
  int n_local;
  CBString *s_local;
  CBStream *this_local;
  
  bstr__cppwrapper_exception.msg.field_2._12_4_ = SUB84(__buf,0);
  local_88 = (bstring)0x0;
  if (CONCAT44(in_register_00000034,__fd) != 0) {
    local_88 = (bstring)(CONCAT44(in_register_00000034,__fd) + 8);
  }
  iVar1 = bsread(local_88,this->m_s,bstr__cppwrapper_exception.msg.field_2._12_4_);
  if (iVar1 < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"CBString::Failed read",&local_69);
    CBStringException::CBStringException((CBStringException *)local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_48);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  return 0;
}

Assistant:

void CBStream::read (CBString& s, int n) {
	if (0 > bsread ((bstring) &s, m_s, n)) {
		bstringThrow ("Failed read");
	}
}